

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

Vec_Ptr_t * Aig_ManDfsArray(Aig_Man_t *p,Aig_Obj_t **pNodes,int nNodes)

{
  int nCap;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar1;
  int local_2c;
  int i;
  Vec_Ptr_t *vNodes;
  int nNodes_local;
  Aig_Obj_t **pNodes_local;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  nCap = Aig_ManObjNumMax(p);
  p_00 = Vec_PtrAlloc(nCap);
  pAVar1 = Aig_ManConst1(p);
  Aig_ObjSetTravIdCurrent(p,pAVar1);
  pAVar1 = Aig_ManConst1(p);
  Vec_PtrPush(p_00,pAVar1);
  for (local_2c = 0; local_2c < nNodes; local_2c = local_2c + 1) {
    Aig_ManDfsAll_rec(p,pNodes[local_2c],p_00);
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsArray( Aig_Man_t * p, Aig_Obj_t ** pNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    Aig_ManIncrementTravId( p );
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // add constant
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    for ( i = 0; i < nNodes; i++ )
        Aig_ManDfsAll_rec( p, pNodes[i], vNodes );
    return vNodes;
}